

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void phys_page_set_level(PhysPageMap *map,PhysPageEntry *lp,hwaddr *index,uint64_t *nb,uint16_t leaf
                        ,int level)

{
  PhysPageEntry *lp_00;
  uint uVar1;
  PhysPageEntry PVar2;
  Node *paPVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  bVar4 = (char)level * '\t';
  uVar8 = 1L << (bVar4 & 0x3f);
  if (0xffffffbf < (uint)*lp && ((uint)*lp & 0x3f) != 0) {
    uVar1 = map->nodes_nb;
    paPVar3 = map->nodes;
    map->nodes_nb = uVar1 + 1;
    if ((ulong)uVar1 == 0x3ffffff) {
      __assert_fail("ret != PHYS_MAP_NODE_NIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x85,"uint32_t phys_map_node_alloc(PhysPageMap *, _Bool)");
    }
    if (uVar1 == map->nodes_nb_alloc) {
      __assert_fail("ret != map->nodes_nb_alloc",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x86,"uint32_t phys_map_node_alloc(PhysPageMap *, _Bool)");
    }
    lVar6 = 0;
    do {
      paPVar3[uVar1][lVar6] =
           (PhysPageEntry)((uint)(level == 0) * 0x40 + (uint)(level != 0) + -0x40);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x200);
    *lp = (PhysPageEntry)((uint)*lp & 0x3f | uVar1 << 6);
  }
  uVar5 = *nb;
  if (uVar5 != 0) {
    PVar2 = *lp;
    paPVar3 = map->nodes;
    uVar7 = (ulong)(((uint)(*index >> (bVar4 & 0x3f)) & 0x1ff) << 2);
    do {
      lp_00 = (PhysPageEntry *)(&paPVar3[(uint)PVar2 >> 6][0].field_0x0 + uVar7);
      if (uVar5 < uVar8 || (*index & uVar8 - 1) != 0) {
        phys_page_set_level(map,lp_00,index,nb,leaf,level + -1);
      }
      else {
        *lp_00 = (PhysPageEntry)((uint)leaf << 6);
        *index = *index + uVar8;
        *nb = *nb - uVar8;
      }
      uVar5 = *nb;
    } while ((uVar5 != 0) && (bVar9 = uVar7 < 0x7fc, uVar7 = uVar7 + 4, bVar9));
  }
  return;
}

Assistant:

static void phys_page_set_level(PhysPageMap *map, PhysPageEntry *lp,
                                hwaddr *index, uint64_t *nb, uint16_t leaf,
                                int level)
{
    PhysPageEntry *p;
    hwaddr step = (hwaddr)1 << (level * P_L2_BITS);

    if (lp->skip && lp->ptr == PHYS_MAP_NODE_NIL) {
        lp->ptr = phys_map_node_alloc(map, level == 0);
    }
    p = map->nodes[lp->ptr];
    lp = &p[(*index >> (level * P_L2_BITS)) & (P_L2_SIZE - 1)];

    while (*nb && lp < &p[P_L2_SIZE]) {
        if ((*index & (step - 1)) == 0 && *nb >= step) {
            lp->skip = 0;
            lp->ptr = leaf;
            *index += step;
            *nb -= step;
        } else {
            phys_page_set_level(map, lp, index, nb, leaf, level - 1);
        }
        ++lp;
    }
}